

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O2

FT_Error pcf_load_font(FT_Stream stream,PCF_Face face,FT_Long face_index)

{
  FT_Byte FVar1;
  char cVar2;
  FT_Memory pFVar3;
  ushort uVar4;
  FT_UShort FVar5;
  FT_UShort FVar6;
  FT_UShort FVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  FT_Error FVar11;
  size_t mm;
  PCF_Table pPVar12;
  FT_ULong FVar13;
  ulong uVar14;
  FT_Pointer P;
  PCF_Metric metric;
  FT_Pointer pvVar15;
  FT_Byte *buffer;
  ulong uVar16;
  PCF_Property pPVar17;
  size_t sVar18;
  FT_String *pFVar19;
  size_t sVar20;
  FT_Bitmap_Size *pFVar21;
  ulong uVar22;
  PCF_Property pPVar23;
  char *pcVar24;
  int iVar25;
  int iVar26;
  FT_ULong *pFVar27;
  long lVar28;
  FT_ULong FVar29;
  PCF_Table pPVar30;
  FT_Frame_Field *fields;
  PCF_Encoding pPVar31;
  PCF_Table pPVar32;
  FT_Long FVar33;
  uint uVar34;
  FT_ULong new_count;
  FT_Pointer count;
  FT_ULong FVar35;
  FT_Bitmap_Size *bsize;
  bool bVar36;
  FT_Error error;
  FT_Error local_cc;
  FT_Memory local_c8;
  PCF_Property local_c0;
  FT_ULong local_b8;
  PCF_Encoding local_b0;
  FT_Memory local_a8;
  FT_Memory local_a0;
  ulong local_98;
  uint local_8c;
  FT_ULong size;
  char *strings [4];
  long local_38;
  
  pFVar3 = (face->root).memory;
  FVar11 = FT_Stream_Seek(stream,0);
  if (FVar11 != 0) {
    return 3;
  }
  FVar11 = FT_Stream_ReadFields(stream,pcf_toc_header,&face->toc);
  size = CONCAT44(size._4_4_,FVar11);
  if (FVar11 != 0) {
    return 3;
  }
  if ((face->toc).version != 0x70636601) {
    return 3;
  }
  uVar14 = (face->toc).count;
  if (uVar14 == 0) {
    return 3;
  }
  uVar22 = stream->size;
  if (uVar22 < 0x10) {
    return 3;
  }
  if (9 < uVar14 || uVar22 >> 4 < uVar14) {
    uVar14 = uVar22 >> 4;
    if (0x8f < uVar22) {
      uVar14 = 9;
    }
    (face->toc).count = uVar14;
  }
  uVar22 = 0;
  local_a0 = pFVar3;
  pPVar12 = (PCF_Table)ft_mem_realloc(pFVar3,0x20,0,uVar14,(void *)0x0,(FT_Error *)&size);
  (face->toc).tables = pPVar12;
  if ((int)size != 0) {
    return 3;
  }
  while( true ) {
    uVar14 = (face->toc).count;
    if (uVar14 <= uVar22) break;
    FVar11 = FT_Stream_ReadFields(stream,pcf_table_header,pPVar12);
    size = CONCAT44(size._4_4_,FVar11);
    if (FVar11 != 0) goto LAB_0014517f;
    pPVar12 = pPVar12 + 1;
    uVar22 = (ulong)((int)uVar22 + 1);
  }
  pPVar12 = (face->toc).tables;
  uVar34 = 0;
  do {
    uVar22 = uVar14 - 1;
    if (uVar22 <= uVar34) goto LAB_0014513c;
    bVar36 = false;
    uVar22 = 1;
    while( true ) {
      uVar16 = (ulong)((int)uVar22 - 1);
      if (uVar14 + ~(ulong)uVar34 <= uVar16) break;
      pPVar30 = pPVar12 + uVar16;
      uVar14 = pPVar12[uVar22].offset;
      if (uVar14 < pPVar12[uVar16].offset) {
        pPVar32 = pPVar12 + uVar22;
        strings[0] = (char *)pPVar30->type;
        strings[1] = (char *)pPVar30->format;
        strings[2] = (char *)pPVar30->size;
        strings[3] = (char *)pPVar30->offset;
        FVar13 = pPVar32->type;
        FVar29 = pPVar32->format;
        FVar35 = pPVar32->offset;
        pPVar30->size = pPVar32->size;
        pPVar30->offset = FVar35;
        pPVar30->type = FVar13;
        pPVar30->format = FVar29;
        pPVar32->size = (FT_ULong)strings[2];
        pPVar32->offset = (FT_ULong)strings[3];
        pPVar32->type = (FT_ULong)strings[0];
        pPVar32->format = (FT_ULong)strings[1];
        uVar14 = pPVar32->offset;
        bVar36 = true;
      }
      if ((uVar14 < pPVar30->size) || (uVar14 - pPVar30->size < pPVar30->offset)) {
        size = CONCAT44(size._4_4_,9);
        goto LAB_0014517f;
      }
      uVar14 = (face->toc).count;
      uVar22 = (ulong)((int)uVar22 + 1);
    }
    uVar34 = uVar34 + 1;
  } while (bVar36);
  uVar22 = uVar14 - 1;
LAB_0014513c:
  pPVar12 = (face->toc).tables;
  uVar14 = stream->size;
  pFVar27 = &pPVar12->size;
  for (uVar34 = 0; uVar34 < uVar22; uVar34 = uVar34 + 1) {
    if ((uVar14 < *pFVar27) || (uVar14 - *pFVar27 < pFVar27[1])) goto LAB_0014537e;
    pFVar27 = pFVar27 + 4;
  }
  uVar22 = uVar14 - pFVar27[1];
  if (uVar14 < pFVar27[1]) {
LAB_0014537e:
    size = CONCAT44(size._4_4_,8);
LAB_0014517f:
    ft_mem_free(local_a0,(face->toc).tables);
    (face->toc).tables = (PCF_Table)0x0;
    local_cc = (int)size;
    if ((int)size != 0) {
      return 3;
    }
    pPVar12 = (PCF_Table)0x0;
  }
  else {
    if (uVar22 < *pFVar27) {
      *pFVar27 = uVar22;
    }
    local_cc = 0;
  }
  (face->root).num_faces = 1;
  (face->root).face_index = 0;
  if (face_index < 0) {
    return 0;
  }
  pFVar3 = (face->root).memory;
  error = pcf_seek_to_table_type(stream,pPVar12,(face->toc).count,1,(FT_ULong *)strings,&size);
  if ((error == 0) &&
     (FVar13 = FT_Stream_ReadULongLE(stream,&error), (FVar13 & 0xffffff00) == 0 && error == 0)) {
    if ((FVar13 & 4) == 0) {
      uVar14 = FT_Stream_ReadULongLE(stream,&error);
    }
    else {
      uVar14 = FT_Stream_ReadULong(stream,&error);
    }
    if (error != 0) goto LAB_0014526e;
    local_c0 = (PCF_Property)size;
    if (size / 9 < uVar14) {
      error = 8;
      goto LAB_0014526e;
    }
    local_b0 = (PCF_Encoding)0x100;
    if (uVar14 < 0x100) {
      local_b0 = (PCF_Encoding)uVar14;
    }
    face->nprops = (int)local_b0;
    buffer = (FT_Byte *)0x0;
    local_c8 = (FT_Memory)FVar13;
    local_a8 = (FT_Memory)uVar14;
    P = ft_mem_realloc(pFVar3,0x18,0,(FT_Long)local_b0,(void *)0x0,&error);
    if (error == 0) {
      local_b8 = (long)local_b0 * 0x18;
      buffer = (FT_Byte *)0x0;
      for (FVar13 = 0; local_b8 != FVar13; FVar13 = FVar13 + 0x18) {
        if (((ulong)local_c8 & 4) == 0) {
          fields = pcf_property_header;
        }
        else {
          fields = pcf_property_msb_header;
        }
        error = FT_Stream_ReadFields(stream,fields,(void *)(FVar13 + (long)P));
        if (error != 0) goto LAB_00145273;
        error = 0;
      }
      error = FT_Stream_Skip(stream,((long)local_a8 - (long)local_b0) * 9);
      if (error == 0) {
        FVar11 = 0;
        if ((((ulong)local_a8 & 3) != 0) &&
           (FVar11 = FT_Stream_Skip(stream,4 - ((ulong)local_a8 & 3)), FVar11 != 0))
        goto LAB_0014547f;
        error = FVar11;
        if (((ulong)local_c8 & 4) == 0) {
          pvVar15 = (FT_Pointer)FT_Stream_ReadULongLE(stream,&error);
        }
        else {
          pvVar15 = (FT_Pointer)FT_Stream_ReadULong(stream,&error);
        }
        if (error == 0) {
          if (pvVar15 <= (FT_Pointer)((long)local_c0 + (long)local_a8 * -9)) {
            count = (FT_Pointer)0x1000100;
            if (pvVar15 < (FT_Pointer)0x1000100) {
              count = pvVar15;
            }
            buffer = (FT_Byte *)ft_mem_realloc(pFVar3,1,0,(long)count + 1,(void *)0x0,&error);
            if (((error == 0) && (error = FT_Stream_Read(stream,buffer,(FT_ULong)count), error == 0)
                ) && (local_c0 = (PCF_Property)
                                 ft_mem_realloc(pFVar3,0x18,0,(FT_Long)local_b0,(void *)0x0,&error),
                     error == 0)) {
              face->properties = local_c0;
              for (local_c8 = (FT_Memory)0x0; (FT_Memory)local_b8 != local_c8;
                  local_c8 = (FT_Memory)((long)local_c8 + 0x18)) {
                if (count < *(FT_Pointer *)((long)P + (long)local_c8)) {
LAB_001458ad:
                  error = 9;
                  goto LAB_00145273;
                }
                pvVar15 = ft_mem_strdup(pFVar3,(char *)((long)*(FT_Pointer *)
                                                               ((long)P + (long)local_c8) +
                                                       (long)buffer),&error);
                *(FT_Pointer *)((long)&local_c0->name + (long)local_c8) = pvVar15;
                if (error != 0) goto LAB_00145273;
                FVar1 = *(FT_Byte *)((long)P + (long)local_c8 + 8U);
                (&local_c0->isString)[(long)local_c8] = FVar1;
                pvVar15 = *(FT_Pointer *)((long)P + (long)local_c8 + 0x10U);
                if (FVar1 == '\0') {
                  *(FT_Pointer *)((long)&local_c0->value + (long)local_c8) = pvVar15;
                }
                else {
                  if (count < pvVar15) goto LAB_001458ad;
                  pvVar15 = ft_mem_strdup(pFVar3,(char *)((long)pvVar15 + (long)buffer),&error);
                  *(FT_Pointer *)((long)&local_c0->value + (long)local_c8) = pvVar15;
                  if (error != 0) goto LAB_00145273;
                }
              }
              error = 0;
            }
            goto LAB_00145273;
          }
          error = 8;
        }
      }
      else {
LAB_0014547f:
        error = 0x53;
      }
      buffer = (FT_Byte *)0x0;
    }
  }
  else {
LAB_0014526e:
    buffer = (FT_Byte *)0x0;
    P = (void *)0x0;
  }
LAB_00145273:
  ft_mem_free(pFVar3,P);
  ft_mem_free(pFVar3,buffer);
  local_cc = error;
  if (error != 0) {
    return 3;
  }
  FVar13 = (face->toc).count;
  pPVar30 = (face->toc).tables;
  FVar29 = 0xffffffffffffffff;
  pPVar12 = pPVar30;
  do {
    FVar29 = FVar29 + 1;
    if (FVar13 == FVar29) {
      FVar11 = pcf_get_accel(stream,face,2);
      if (FVar11 != 0) {
        return 3;
      }
      pPVar30 = (face->toc).tables;
      local_cc = 0;
      FVar35 = (face->toc).count;
      break;
    }
    pFVar27 = &pPVar12->type;
    pPVar12 = pPVar12 + 1;
    FVar35 = FVar13;
  } while (*pFVar27 != 0x100);
  local_c8 = (face->root).memory;
  error = pcf_seek_to_table_type(stream,pPVar30,FVar35,4,(FT_ULong *)strings,&size);
  if (error != 0) {
    return 3;
  }
  local_b8 = FT_Stream_ReadULongLE(stream,&error);
  if (error != 0) {
    return 3;
  }
  if ((local_b8 & 0xfffffe00) != 0) {
    return 3;
  }
  uVar14 = local_b8 & 0xffffff00;
  if ((local_b8 & 0xffffff00) == 0) {
    if ((local_b8 & 4) == 0) {
      FVar35 = FT_Stream_ReadULongLE(stream,&error);
    }
    else {
      FVar35 = FT_Stream_ReadULong(stream,&error);
    }
  }
  else {
    if ((local_b8 & 4) == 0) {
      uVar4 = FT_Stream_ReadUShortLE(stream,&error);
    }
    else {
      uVar4 = FT_Stream_ReadUShort(stream,&error);
    }
    FVar35 = (FT_ULong)uVar4;
  }
  if (error != 0) {
    return 3;
  }
  local_c0 = (PCF_Property)0x5;
  if (uVar14 == 0) {
    uVar14 = 0xc;
  }
  else {
    uVar14 = 5;
  }
  if (size / uVar14 <= FVar35 - 1) {
    return 3;
  }
  new_count = 0x10000;
  if (FVar35 < 0x10000) {
    new_count = FVar35;
  }
  face->nmetrics = new_count;
  metric = (PCF_Metric)ft_mem_realloc(local_c8,0x18,0,new_count,(void *)0x0,&error);
  face->metrics = metric;
  if (error != 0) {
    return 3;
  }
  while (bVar36 = new_count != 0, new_count = new_count - 1, bVar36) {
    error = pcf_get_metric(stream,local_b8,metric);
    metric->bits = 0;
    if (error != 0) {
      ft_mem_free(local_c8,face->metrics);
      face->metrics = (PCF_Metric)0x0;
      local_cc = error;
      if (error != 0) {
        return 3;
      }
      goto LAB_001455de;
    }
    if ((metric->rightSideBearing < metric->leftSideBearing) ||
       (SBORROW4((int)metric->ascent,-(int)metric->descent) !=
        (int)metric->ascent + (int)metric->descent < 0)) {
      metric->descent = 0;
      metric->leftSideBearing = 0;
      metric->rightSideBearing = 0;
      metric->characterWidth = 0;
      metric->ascent = 0;
    }
    metric = metric + 1;
  }
  local_cc = 0;
LAB_001455de:
  local_c8 = (face->root).memory;
  FVar11 = pcf_seek_to_table_type
                     (stream,(face->toc).tables,(face->toc).count,8,(FT_ULong *)strings,&size);
  if (FVar11 != 0) {
    return 3;
  }
  error = FT_Stream_EnterFrame(stream,8);
  if (error != 0) {
    return 3;
  }
  local_b8 = FT_Stream_GetULongLE(stream);
  if ((local_b8 & 4) == 0) {
    uVar14 = FT_Stream_GetULongLE(stream);
  }
  else {
    uVar14 = FT_Stream_GetULong(stream);
  }
  FT_Stream_ExitFrame(stream);
  if ((local_b8 & 0xffffff00) != 0) {
    return 3;
  }
  uVar22 = 0x10000;
  if (uVar14 < 0x10000) {
    uVar22 = uVar14;
  }
  if (uVar22 != face->nmetrics) {
    return 3;
  }
  local_b0 = (PCF_Encoding)ft_mem_realloc(local_c8,8,0,uVar22,(void *)0x0,&error);
  if (error != 0) {
    return 3;
  }
  for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
    if ((local_b8 & 4) == 0) {
      uVar16 = FT_Stream_ReadULongLE(stream,&error);
    }
    else {
      uVar16 = FT_Stream_ReadULong(stream,&error);
    }
    *(ulong *)((long)local_b0 + uVar14 * 8) = uVar16;
  }
  if (error == 0) {
LAB_0014587e:
    local_c0 = (PCF_Property)((long)local_c0 + -1);
    if (local_c0 != (PCF_Property)0x0) goto code_r0x00145885;
    pPVar31 = local_b0;
    for (lVar28 = 0; uVar22 * 0x18 - lVar28 != 0; lVar28 = lVar28 + 0x18) {
      uVar14 = *(ulong *)pPVar31;
      if ((-1 < (long)uVar14) && (uVar14 <= size)) {
        *(ulong *)((long)&face->metrics->bits + lVar28) = uVar14 + stream->pos;
      }
      pPVar31 = (PCF_Encoding)((long)pPVar31 + 8);
    }
    face->bitmapsFormat = local_b8;
  }
LAB_0014590c:
  ft_mem_free(local_c8,local_b0);
  local_cc = error;
  if (error != 0) {
    return 3;
  }
  local_a8 = (face->root).memory;
  FVar11 = pcf_seek_to_table_type
                     (stream,(face->toc).tables,(face->toc).count,0x20,(FT_ULong *)strings,&size);
  if (FVar11 != 0) {
    return 3;
  }
  error = FT_Stream_EnterFrame(stream,0xe);
  if (error != 0) {
    return 3;
  }
  local_b8 = FT_Stream_GetULongLE(stream);
  if ((local_b8 & 4) == 0) {
    FVar5 = FT_Stream_GetUShortLE(stream);
    FVar6 = FT_Stream_GetUShortLE(stream);
    FVar7 = FT_Stream_GetUShortLE(stream);
    local_c8 = (FT_Memory)CONCAT62(local_c8._2_6_,FVar7);
    FVar7 = FT_Stream_GetUShortLE(stream);
    local_c0 = (PCF_Property)CONCAT62(local_c0._2_6_,FVar7);
    FVar7 = FT_Stream_GetUShortLE(stream);
  }
  else {
    FVar5 = FT_Stream_GetUShort(stream);
    FVar6 = FT_Stream_GetUShort(stream);
    FVar7 = FT_Stream_GetUShort(stream);
    local_c8 = (FT_Memory)CONCAT62(local_c8._2_6_,FVar7);
    FVar7 = FT_Stream_GetUShort(stream);
    local_c0 = (PCF_Property)CONCAT62(local_c0._2_6_,FVar7);
    FVar7 = FT_Stream_GetUShort(stream);
  }
  face->defaultChar = FVar7;
  FT_Stream_ExitFrame(stream);
  if ((short)FVar5 < 0 || (local_b8 & 0xffffff00) != 0) {
    return 3;
  }
  local_98 = CONCAT44(local_98._4_4_,(int)(short)local_c8);
  if ((short)local_c8 < 0 || (0xff < (short)FVar6 || (short)FVar6 < (short)FVar5)) {
    return 3;
  }
  if (0xff < (short)local_c0 || (short)local_c0 < (short)local_c8) {
    return 3;
  }
  iVar25 = (int)(short)local_c0;
  local_8c = (uint)(short)FVar5;
  local_c0 = (PCF_Property)CONCAT44(local_c0._4_4_,(int)(short)FVar6);
  lVar28 = (long)((iVar25 - (short)local_c8) + 1) * (long)(int)(((int)(short)FVar6 - local_8c) + 1);
  local_b0 = (PCF_Encoding)ft_mem_realloc(local_a8,0x10,0,lVar28,(void *)0x0,&error);
  if (error != 0) {
    return 3;
  }
  error = FT_Stream_EnterFrame(stream,lVar28 * 2);
  if (error == 0) {
    local_98 = local_98 & 0xffffffff;
    local_38 = local_98 * 0x100 + (ulong)local_8c;
    FVar35 = 0;
    for (; (int)local_98 <= iVar25; local_98 = local_98 + 1) {
      local_c8 = (FT_Memory)local_38;
      for (uVar34 = local_8c; (int)uVar34 <= (int)local_c0; uVar34 = uVar34 + 1) {
        if ((local_b8 & 4) == 0) {
          FVar5 = FT_Stream_GetUShortLE(stream);
        }
        else {
          FVar5 = FT_Stream_GetUShort(stream);
        }
        if (FVar5 != 0xffff) {
          local_b0[FVar35].enc = (FT_Long)local_c8;
          local_b0[FVar35].glyph = FVar5;
          FVar35 = FVar35 + 1;
        }
        local_c8 = (FT_Memory)((long)local_c8 + 1);
      }
      local_38 = local_38 + 0x100;
    }
    FT_Stream_ExitFrame(stream);
    local_b0 = (PCF_Encoding)ft_mem_realloc(local_a8,0x10,lVar28,FVar35,local_b0,&error);
    if (error != 0) goto LAB_00145bc1;
    face->nencodings = FVar35;
    face->encodings = local_b0;
    local_cc = 0;
  }
  else {
LAB_00145bc1:
    ft_mem_free(local_a8,local_b0);
    local_cc = error;
    if (error != 0) {
      return 3;
    }
  }
  if ((FVar13 != FVar29) && (local_cc = pcf_get_accel(stream,face,0x100), local_cc != 0)) {
    return 3;
  }
  uVar14 = (face->root).face_flags;
  (face->root).face_flags = uVar14 | 0x92;
  if ((face->accel).constantWidth != '\0') {
    (face->root).face_flags = uVar14 | 0x96;
  }
  error = 0;
  pFVar3 = (face->root).memory;
  strings[2] = (char *)0x0;
  strings[3] = (char *)0x0;
  strings[0] = (char *)0x0;
  strings[1] = (char *)0x0;
  (face->root).style_flags = 0;
  pPVar17 = pcf_find_property(face,"SLANT");
  FVar33 = 2;
  if ((((pPVar17 != (PCF_Property)0x0) && (pPVar17->isString != '\0')) &&
      (uVar34 = (byte)*(pPVar17->value).atom - 0x49, uVar34 < 0x27)) &&
     ((0x4100000041U >> ((ulong)uVar34 & 0x3f) & 1) != 0)) {
    (face->root).style_flags = 1;
    strings[2] = "Italic";
    if ((*(pPVar17->value).atom & 0xdfU) == 0x4f) {
      strings[2] = "Oblique";
    }
    FVar33 = 3;
  }
  pPVar17 = pcf_find_property(face,"WEIGHT_NAME");
  if (((pPVar17 != (PCF_Property)0x0) && (pPVar17->isString != '\0')) &&
     ((byte)(*(pPVar17->value).atom | 0x20U) == 0x62)) {
    (face->root).style_flags = FVar33;
    strings[1] = "Bold";
  }
  pPVar17 = pcf_find_property(face,"SETWIDTH_NAME");
  if ((pPVar17 != (PCF_Property)0x0) && (pPVar17->isString != '\0')) {
    cVar2 = *(pPVar17->value).atom;
    if ((cVar2 != '\0') && ((cVar2 != 'N' && (cVar2 != 'n')))) {
      strings[3] = (pPVar17->value).atom;
    }
  }
  pPVar17 = pcf_find_property(face,"ADD_STYLE_NAME");
  if ((pPVar17 != (PCF_Property)0x0) && (pPVar17->isString != '\0')) {
    cVar2 = *(pPVar17->value).atom;
    if ((cVar2 != '\0') && ((cVar2 != 'N' && (cVar2 != 'n')))) {
      strings[0] = (pPVar17->value).atom;
    }
  }
  FVar33 = 0;
  for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
    (&size)[lVar28] = 0;
    if (strings[lVar28] != (char *)0x0) {
      sVar18 = strlen(strings[lVar28]);
      (&size)[lVar28] = sVar18;
      FVar33 = FVar33 + sVar18 + 1;
    }
  }
  if (FVar33 == 0) {
    strings[0] = "Regular";
    size = 7;
    FVar33 = 8;
  }
  pFVar19 = (FT_String *)ft_mem_alloc(pFVar3,FVar33,&error);
  (face->root).style_name = pFVar19;
  if (error != 0) {
    return 3;
  }
  for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
    pcVar24 = strings[lVar28];
    if (pcVar24 != (char *)0x0) {
      sVar18 = (&size)[lVar28];
      if (pFVar19 != (face->root).style_name) {
        *pFVar19 = ' ';
        pFVar19 = pFVar19 + 1;
      }
      memcpy(pFVar19,pcVar24,sVar18);
      if ((lVar28 == 3) || (lVar28 == 0)) {
        for (sVar20 = 0; sVar18 != sVar20; sVar20 = sVar20 + 1) {
          if (pFVar19[sVar20] == ' ') {
            pFVar19[sVar20] = '-';
          }
        }
      }
      pFVar19 = pFVar19 + sVar18;
    }
  }
  *pFVar19 = '\0';
  local_cc = error;
  if (error != 0) {
    return 3;
  }
  pPVar17 = pcf_find_property(face,"FAMILY_NAME");
  if ((pPVar17 == (PCF_Property)0x0) || (pPVar17->isString == '\0')) {
    (face->root).family_name = (FT_String *)0x0;
  }
  else {
    pFVar19 = (FT_String *)ft_mem_strdup(local_a0,(pPVar17->value).atom,&local_cc);
    (face->root).family_name = pFVar19;
    if (local_cc != 0) {
      return 3;
    }
  }
  (face->root).num_glyphs = face->nmetrics + 1;
  (face->root).num_fixed_sizes = 1;
  pFVar21 = (FT_Bitmap_Size *)ft_mem_realloc(local_a0,0x20,0,1,(void *)0x0,&local_cc);
  (face->root).available_sizes = pFVar21;
  if (local_cc != 0) {
    return 3;
  }
  pFVar21->x_ppem = 0;
  pFVar21->y_ppem = 0;
  pFVar21->height = 0;
  pFVar21->width = 0;
  *(undefined4 *)&pFVar21->field_0x4 = 0;
  pFVar21->size = 0;
  uVar22 = (face->accel).fontDescent + (face->accel).fontAscent;
  uVar14 = -uVar22;
  if (0 < (long)uVar22) {
    uVar14 = uVar22;
  }
  sVar9 = 0x7fff;
  if (uVar14 < 0x8000) {
    sVar8 = (short)uVar22;
    sVar9 = -sVar8;
    if (0 < sVar8) {
      sVar9 = sVar8;
    }
  }
  pFVar21->height = sVar9;
  pPVar17 = pcf_find_property(face,"AVERAGE_WIDTH");
  if (pPVar17 == (PCF_Property)0x0) {
    FVar33 = FT_MulDiv((long)sVar9,2,3);
    sVar9 = (short)FVar33;
  }
  else {
    FVar13 = (pPVar17->value).ul;
    uVar14 = -FVar13;
    if (0 < (long)FVar13) {
      uVar14 = FVar13;
    }
    sVar9 = 0x7fff;
    if (uVar14 < 0x4fff2) {
      sVar8 = (short)((long)(FVar13 + 5) / 10);
      sVar9 = -sVar8;
      if (0 < sVar8) {
        sVar9 = sVar8;
      }
    }
  }
  pFVar21->width = sVar9;
  pPVar17 = pcf_find_property(face,"POINT_SIZE");
  if (pPVar17 != (PCF_Property)0x0) {
    uVar14 = (pPVar17->value).l;
    uVar22 = -uVar14;
    if (0 < (long)uVar14) {
      uVar22 = uVar14;
    }
    FVar33 = 0x7fff;
    if (uVar22 < 0x504c3) {
      FVar33 = FT_MulDiv(uVar22,0x70800,0x11a4e);
    }
    pFVar21->size = FVar33;
  }
  pPVar17 = pcf_find_property(face,"PIXEL_SIZE");
  if (pPVar17 != (PCF_Property)0x0) {
    FVar13 = (pPVar17->value).ul;
    uVar14 = -FVar13;
    if (0 < (long)FVar13) {
      uVar14 = FVar13;
    }
    uVar22 = 0x1fffc0;
    if (uVar14 < 0x8000) {
      iVar26 = (int)(short)FVar13;
      iVar25 = -iVar26;
      if (0 < iVar26) {
        iVar25 = iVar26;
      }
      uVar22 = (ulong)(uint)(iVar25 << 6);
    }
    pFVar21->y_ppem = uVar22;
  }
  pPVar17 = pcf_find_property(face,"RESOLUTION_X");
  if (pPVar17 == (PCF_Property)0x0) {
    sVar9 = 0;
  }
  else {
    uVar14 = (pPVar17->value).l;
    uVar22 = -uVar14;
    if (0 < (long)uVar14) {
      uVar22 = uVar14;
    }
    sVar9 = 0x7fff;
    if (uVar22 < 0x8000) {
      sVar8 = (short)uVar14;
      sVar9 = -sVar8;
      if (0 < sVar8) {
        sVar9 = sVar8;
      }
    }
  }
  pPVar17 = pcf_find_property(face,"RESOLUTION_Y");
  if (pPVar17 == (PCF_Property)0x0) {
    sVar8 = 0;
  }
  else {
    uVar14 = (pPVar17->value).l;
    uVar22 = -uVar14;
    if (0 < (long)uVar14) {
      uVar22 = uVar14;
    }
    sVar8 = 0x7fff;
    if (uVar22 < 0x8000) {
      sVar10 = (short)uVar14;
      sVar8 = -sVar10;
      if (0 < sVar10) {
        sVar8 = sVar10;
      }
    }
  }
  FVar33 = pFVar21->y_ppem;
  if (FVar33 == 0) {
    FVar33 = pFVar21->size;
    pFVar21->y_ppem = FVar33;
    if (sVar8 == 0) goto LAB_001460bd;
    FVar33 = FT_MulDiv(FVar33,(long)sVar8,0x48);
    pFVar21->y_ppem = FVar33;
  }
  if ((sVar9 != 0) && (sVar8 != 0)) {
    FVar33 = FT_MulDiv(FVar33,(long)sVar9,(long)sVar8);
  }
LAB_001460bd:
  pFVar21->x_ppem = FVar33;
  pPVar17 = pcf_find_property(face,"CHARSET_REGISTRY");
  pPVar23 = pcf_find_property(face,"CHARSET_ENCODING");
  if (((pPVar17 != (PCF_Property)0x0) && (pPVar23 != (PCF_Property)0x0 && pPVar17->isString != '\0')
      ) && (pPVar23->isString != '\0')) {
    pcVar24 = (char *)ft_mem_strdup(local_a0,(pPVar23->value).atom,&local_cc);
    face->charset_encoding = pcVar24;
    if (local_cc != 0) {
      return 3;
    }
    pcVar24 = (char *)ft_mem_strdup(local_a0,(pPVar17->value).atom,&local_cc);
    face->charset_registry = pcVar24;
  }
  if (local_cc != 0) {
    return 3;
  }
  return 0;
code_r0x00145885:
  if ((local_b8 & 4) == 0) {
    FT_Stream_ReadULongLE(stream,&error);
  }
  else {
    FT_Stream_ReadULong(stream,&error);
  }
  if (error != 0) goto LAB_0014590c;
  goto LAB_0014587e;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pcf_load_font( FT_Stream  stream,
                 PCF_Face   face,
                 FT_Long    face_index )
  {
    FT_Face    root   = FT_FACE( face );
    FT_Error   error;
    FT_Memory  memory = FT_FACE( face )->memory;
    FT_Bool    hasBDFAccelerators;


    error = pcf_read_TOC( stream, face );
    if ( error )
      goto Exit;

    root->num_faces  = 1;
    root->face_index = 0;

    /* If we are performing a simple font format check, exit immediately. */
    if ( face_index < 0 )
      return FT_Err_Ok;

    error = pcf_get_properties( stream, face );
    if ( error )
      goto Exit;

    /* Use the old accelerators if no BDF accelerators are in the file. */
    hasBDFAccelerators = pcf_has_table_type( face->toc.tables,
                                             face->toc.count,
                                             PCF_BDF_ACCELERATORS );
    if ( !hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* metrics */
    error = pcf_get_metrics( stream, face );
    if ( error )
      goto Exit;

    /* bitmaps */
    error = pcf_get_bitmaps( stream, face );
    if ( error )
      goto Exit;

    /* encodings */
    error = pcf_get_encodings( stream, face );
    if ( error )
      goto Exit;

    /* BDF style accelerators (i.e. bounds based on encoded glyphs) */
    if ( hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_BDF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* XXX: TO DO: inkmetrics and glyph_names are missing */

    /* now construct the face object */
    {
      PCF_Property  prop;


      root->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                          FT_FACE_FLAG_HORIZONTAL  |
                          FT_FACE_FLAG_FAST_GLYPHS;

      if ( face->accel.constantWidth )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( FT_SET_ERROR( pcf_interpret_style( face ) ) )
        goto Exit;

      prop = pcf_find_property( face, "FAMILY_NAME" );
      if ( prop && prop->isString )
      {

#ifdef PCF_CONFIG_OPTION_LONG_FAMILY_NAMES

        PCF_Driver  driver = (PCF_Driver)FT_FACE_DRIVER( face );


        if ( !driver->no_long_family_names )
        {
          /* Prepend the foundry name plus a space to the family name.     */
          /* There are many fonts just called `Fixed' which look           */
          /* completely different, and which have nothing to do with each  */
          /* other.  When selecting `Fixed' in KDE or Gnome one gets       */
          /* results that appear rather random, the style changes often if */
          /* one changes the size and one cannot select some fonts at all. */
          /*                                                               */
          /* We also check whether we have `wide' characters; all put      */
          /* together, we get family names like `Sony Fixed' or `Misc      */
          /* Fixed Wide'.                                                  */

          PCF_Property  foundry_prop, point_size_prop, average_width_prop;

          int  l    = ft_strlen( prop->value.atom ) + 1;
          int  wide = 0;


          foundry_prop       = pcf_find_property( face, "FOUNDRY" );
          point_size_prop    = pcf_find_property( face, "POINT_SIZE" );
          average_width_prop = pcf_find_property( face, "AVERAGE_WIDTH" );

          if ( point_size_prop && average_width_prop )
          {
            if ( average_width_prop->value.l >= point_size_prop->value.l )
            {
              /* This font is at least square shaped or even wider */
              wide = 1;
              l   += ft_strlen( " Wide" );
            }
          }

          if ( foundry_prop && foundry_prop->isString )
          {
            l += ft_strlen( foundry_prop->value.atom ) + 1;

            if ( FT_NEW_ARRAY( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, foundry_prop->value.atom );
            ft_strcat( root->family_name, " " );
            ft_strcat( root->family_name, prop->value.atom );
          }
          else
          {
            if ( FT_NEW_ARRAY( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, prop->value.atom );
          }

          if ( wide )
            ft_strcat( root->family_name, " Wide" );
        }
        else

#endif /* PCF_CONFIG_OPTION_LONG_FAMILY_NAMES */

        {
          if ( FT_STRDUP( root->family_name, prop->value.atom ) )
            goto Exit;
        }
      }
      else
        root->family_name = NULL;

      /*
       * Note: We shift all glyph indices by +1 since we must
       * respect the convention that glyph 0 always corresponds
       * to the `missing glyph'.
       *
       * This implies bumping the number of `available' glyphs by 1.
       */
      root->num_glyphs = (FT_Long)( face->nmetrics + 1 );

      root->num_fixed_sizes = 1;
      if ( FT_NEW_ARRAY( root->available_sizes, 1 ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = root->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;


        FT_ZERO( bsize );

        /* for simplicity, we take absolute values of integer properties */

#if 0
        bsize->height = face->accel.maxbounds.ascent << 6;
#endif

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( face->accel.fontAscent + face->accel.fontDescent < 0 )
          FT_TRACE0(( "pcf_load_font: negative height\n" ));
#endif
        if ( FT_ABS( face->accel.fontAscent +
                     face->accel.fontDescent ) > 0x7FFF )
        {
          bsize->height = 0x7FFF;
          FT_TRACE0(( "pcf_load_font: clamping height to value %d\n",
                      bsize->height ));
        }
        else
          bsize->height = FT_ABS( (FT_Short)( face->accel.fontAscent +
                                              face->accel.fontDescent ) );

        prop = pcf_find_property( face, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative average width\n" ));
#endif
          if ( ( FT_ABS( prop->value.l ) > 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = (FT_Short)FT_MulDiv( bsize->height, 2, 3 );
        }

        prop = pcf_find_property( face, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( FT_ABS( prop->value.l ) > 0x504C2L ) /* 0x7FFF * 72270/7200 */
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }

        prop = pcf_find_property( face, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative pixel size\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "pcf_load_font: clamping pixel size to value %d\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = pcf_find_property( face, "RESOLUTION_X" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative X resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)prop->value.l );
        }

        prop = pcf_find_property( face, "RESOLUTION_Y" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative Y resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)prop->value.l );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* set up charset */
      {
        PCF_Property  charset_registry, charset_encoding;


        charset_registry = pcf_find_property( face, "CHARSET_REGISTRY" );
        charset_encoding = pcf_find_property( face, "CHARSET_ENCODING" );

        if ( charset_registry && charset_registry->isString &&
             charset_encoding && charset_encoding->isString )
        {
          if ( FT_STRDUP( face->charset_encoding,
                          charset_encoding->value.atom ) ||
               FT_STRDUP( face->charset_registry,
                          charset_registry->value.atom ) )
            goto Exit;
        }
      }
    }

  Exit:
    if ( error )
    {
      /* This is done to respect the behaviour of the original */
      /* PCF font driver.                                      */
      error = FT_THROW( Invalid_File_Format );
    }

    return error;
  }